

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageLoadAndStoreCase::iterate
          (ImageLoadAndStoreCase *this)

{
  ostringstream *poVar1;
  IVec3 *__x;
  int *piVar2;
  ushort uVar3;
  ChannelType CVar4;
  ChannelType CVar5;
  TestLog *log;
  pointer pPVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  undefined1 auVar9 [16];
  GLenum target;
  bool bVar10;
  Float<unsigned_short,_5,_10,_15,_3U> FVar11;
  int iVar12;
  deUint32 dVar13;
  deUint32 format;
  int iVar14;
  ContextType type;
  GLSLVersion version;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *pcVar16;
  undefined8 *puVar17;
  long *plVar18;
  TextureFormat *pTVar19;
  int extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined8 uVar20;
  int iVar21;
  RenderContext *renderContext;
  long *plVar22;
  TextureFormat TVar23;
  ulong *puVar24;
  TextureFormat TVar25;
  uint uVar26;
  int iVar27;
  PixelBufferAccess *__return_storage_ptr__;
  long lVar28;
  void *__src;
  void *pvVar29;
  uint uVar30;
  undefined1 isSampler;
  ulong uVar31;
  ulong uVar32;
  uint x;
  uint uVar33;
  undefined1 auVar34 [8];
  uint uVar35;
  ImageLoadAndStoreCase *pIVar36;
  TextureType formatType;
  bool bVar37;
  uint uVar38;
  float fVar39;
  ulong local_880;
  IVec3 local_878;
  RenderContext *local_868;
  ulong local_860;
  GLenum local_854;
  ulong local_850;
  undefined1 local_848 [8];
  undefined8 uStack_840;
  ImageLoadAndStoreCase *local_830;
  undefined1 local_828 [8];
  float fStack_820;
  float fStack_81c;
  ulong local_810;
  long *local_808;
  long local_800;
  long local_7f8;
  long lStack_7f0;
  CallLogWrapper glLog;
  long *local_7d0 [2];
  long local_7c0 [2];
  ulong *local_7b0;
  long local_7a8;
  ulong local_7a0;
  undefined8 uStack_798;
  TextureFormat *local_790;
  TestLog *local_788;
  void *local_780;
  Vector<int,_4> res_1;
  long local_768;
  int aiStack_760 [4];
  ulong local_750;
  void *local_748;
  undefined1 local_740 [16];
  ulong local_730;
  TextureFormat TStack_728;
  deUint32 local_71c;
  ulong *local_718;
  long local_710;
  ulong local_708 [2];
  PixelBufferAccess sliceAccess;
  long *local_6c8;
  undefined8 local_6c0;
  long local_6b8;
  undefined8 uStack_6b0;
  PixelBufferAccess scratchAccess;
  string shaderImageTypeStr;
  Texture texture1;
  Texture texture0;
  string local_628;
  long *local_608;
  long local_600;
  long local_5f8;
  long lStack_5f0;
  long *local_5e8;
  long local_5e0;
  long local_5d8;
  long lStack_5d0;
  long *local_5c8;
  long local_5c0;
  long local_5b8;
  long lStack_5b0;
  long *local_5a8;
  long local_5a0;
  long local_598;
  long lStack_590;
  long *local_588;
  long local_580;
  long local_578;
  long lStack_570;
  long *local_568;
  long local_560;
  long local_558;
  long lStack_550;
  long *local_548;
  long local_540;
  long local_538;
  long lStack_530;
  long *local_528;
  long local_520;
  long local_518;
  long lStack_510;
  long *local_508;
  long local_500;
  long local_4f8;
  long lStack_4f0;
  long *local_4e8;
  long local_4e0;
  long local_4d8;
  long lStack_4d0;
  long *local_4c8;
  long local_4c0;
  long local_4b8;
  long lStack_4b0;
  long *local_4a8;
  long local_4a0;
  long local_498;
  long lStack_490;
  long *local_488;
  long local_480;
  long local_478;
  long lStack_470;
  long *local_468;
  long local_460;
  long local_458;
  long lStack_450;
  string shaderImageFormatStr;
  Buffer texture1Buf;
  LayeredImage reference;
  string glslVersionDeclaration;
  Buffer texture0Buf;
  IVec4 color;
  undefined1 auStack_340 [8];
  _Rb_tree_node_base local_338;
  size_t local_318;
  ios_base local_2e8 [8];
  ios_base local_2e0 [264];
  TextureLevel scratch;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_148;
  undefined1 local_128 [32];
  Vector<float,_4> res;
  GLuint local_70;
  bool local_48;
  
  local_868 = ((this->super_TestCase).m_context)->m_renderCtx;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar12 = (*local_868->_vptr_RenderContext[3])();
  local_788 = log;
  glu::CallLogWrapper::CallLogWrapper(&glLog,(Functions *)CONCAT44(extraout_var,iVar12),log);
  dVar13 = glu::getInternalFormat(this->m_textureFormat);
  format = glu::getInternalFormat(this->m_imageFormat);
  switch(this->m_textureType) {
  case TEXTURETYPE_2D:
    local_854 = 0xde1;
    goto LAB_014784a9;
  case TEXTURETYPE_CUBE:
    local_854 = 0x8513;
LAB_014784a9:
    local_878.m_data[2] = 1;
    uVar35 = 1;
LAB_014784ee:
    local_878.m_data[0] = 0x40;
    local_878.m_data[1] = 0x40;
    bVar10 = true;
    uVar30 = 0x40;
    uVar26 = 0x40;
    break;
  case TEXTURETYPE_2D_ARRAY:
    local_854 = 0x8c1a;
    goto LAB_014784dc;
  case TEXTURETYPE_3D:
    local_854 = 0x806f;
LAB_014784dc:
    local_878.m_data[2] = 8;
    uVar35 = 8;
    goto LAB_014784ee;
  default:
    local_878.m_data[2] = -1;
    local_878.m_data[0] = -1;
    local_878.m_data[1] = -1;
    uVar35 = 0xffffffff;
    bVar10 = false;
    uVar30 = 0xffffffff;
    uVar26 = 0xffffffff;
    local_854 = 0xffffffff;
    break;
  case TEXTURETYPE_BUFFER:
    local_878.m_data[0] = 0x40;
    local_878.m_data[1] = 1;
    local_878.m_data[2] = 1;
    local_854 = 0x8c2a;
    uVar26 = 0x40;
    bVar10 = true;
    uVar35 = 1;
    uVar30 = 1;
  }
  uVar38 = uVar35;
  if ((int)uVar35 < (int)uVar30) {
    uVar38 = uVar30;
  }
  if ((int)uVar38 < (int)uVar26) {
    uVar38 = uVar26;
  }
  CVar4 = (this->m_textureFormat).type;
  if ((CVar4 < UNORM_BYTE_44) && ((0x58U >> (CVar4 & UNSIGNED_INT16) & 1) != 0)) {
    fVar39 = 1.0;
LAB_0147852e:
    _local_848 = ZEXT416((uint)(fVar39 / (float)(int)(uVar38 - 1)));
  }
  else {
    if (CVar4 < UNORM_INT8) {
      fVar39 = 2.0;
      goto LAB_0147852e;
    }
    _local_848 = ZEXT816(0x3f800000);
  }
  if (CVar4 < UNORM_INT8) {
    uVar38 = 0xbf800000;
  }
  else {
    uVar38 = 0;
  }
  _local_828 = ZEXT416(uVar38);
  uVar38 = 6;
  if (this->m_textureType != TEXTURETYPE_CUBE) {
    uVar38 = uVar35;
  }
  if ((UNSIGNED_INT32 < CVar4) || (bVar37 = true, (0x2c0000000U >> ((ulong)CVar4 & 0x3f) & 1) == 0))
  {
    bVar37 = CVar4 - SIGNED_INT8 < 3;
  }
  iVar12 = (*local_868->_vptr_RenderContext[3])();
  pOVar15 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&texture0Buf.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar12),pOVar15)
  ;
  iVar12 = (*local_868->_vptr_RenderContext[3])();
  pOVar15 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&texture1Buf.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_01,iVar12),pOVar15)
  ;
  iVar12 = (*local_868->_vptr_RenderContext[3])();
  pOVar15 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&texture0.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_02,iVar12),pOVar15);
  iVar12 = (*local_868->_vptr_RenderContext[3])();
  pOVar15 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&texture1.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_03,iVar12),pOVar15);
  local_850 = CONCAT44(local_850._4_4_,uVar30);
  LayeredImage::LayeredImage
            (&reference,this->m_textureType,&this->m_textureFormat,uVar26,uVar30,uVar35);
  glLog.m_enableLog = true;
  poVar1 = (ostringstream *)(color.m_data + 2);
  color.m_data._0_8_ = local_788;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"// Created 2 textures (names ",0x1d);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," and ",5);
  local_71c = dVar13;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&color,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_2e0);
  if (this->m_textureType == TEXTURETYPE_BUFFER) {
    poVar1 = (ostringstream *)(color.m_data + 2);
    color.m_data._0_8_ = local_788;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// Created buffers for the textures (names ",0x2b);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," and ",5);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&color,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_2e0);
  }
  local_830 = this;
  if (0 < (int)uVar38) {
    local_848._4_4_ = local_848._0_4_;
    uStack_840._0_4_ = (float)local_848._0_4_;
    uStack_840._4_4_ = (float)local_848._0_4_;
    local_828._4_4_ = local_828._0_4_;
    fStack_820 = (float)local_828._0_4_;
    fStack_81c = (float)local_828._0_4_;
    local_860 = CONCAT44(local_860._4_4_,-uVar26);
    local_810 = CONCAT44(local_810._4_4_,uVar26 - 1);
    uVar26 = 0;
    do {
      if (bVar10) {
        uVar35 = 0;
        do {
          if (bVar10) {
            uVar33 = ~uVar35 + (uint)local_850 ^ uVar26;
            x = 0;
            uVar30 = (uint)local_810;
            do {
              color.m_data[0] = uVar35 ^ uVar26 ^ x;
              color.m_data[1] = uVar35 ^ uVar26 ^ uVar30;
              color.m_data[2] = uVar33 ^ x;
              color.m_data[3] = uVar33 ^ uVar30;
              if (bVar37) {
                Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                          ((LayeredImage *)&reference,x,uVar35,uVar26,&color);
              }
              else {
                res.m_data[0] =
                     (float)color.m_data[0] * (float)local_848._0_4_ + (float)local_828._0_4_;
                res.m_data[1] =
                     (float)color.m_data[1] * (float)local_848._4_4_ + (float)local_828._4_4_;
                res.m_data[2] = (float)color.m_data[2] * (float)uStack_840 + fStack_820;
                res.m_data[3] = (float)color.m_data[3] * uStack_840._4_4_ + fStack_81c;
                Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                          ((LayeredImage *)&reference,x,uVar35,uVar26,&res);
              }
              x = x + 1;
              uVar30 = uVar30 - 1;
            } while ((GLuint)local_860 + x != 0);
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 != (uint)local_850);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar38);
  }
  local_790 = &local_830->m_imageFormat;
  CVar4 = (local_830->m_textureFormat).type;
  CVar5 = (local_830->m_imageFormat).type;
  if (CVar4 == HALF_FLOAT || CVar5 != HALF_FLOAT) {
    if (CVar4 != FLOAT && CVar5 == FLOAT) {
      iVar14 = tcu::TextureFormat::getPixelSize(local_790);
      iVar12 = 1;
      if (local_790->order != R) {
        iVar12 = (uint)(local_790->order == RGBA) << 2;
      }
      uVar26 = 6;
      if (reference.m_type != TEXTURETYPE_CUBE) {
        uVar26 = reference.m_size.m_data[2];
      }
      if (0 < (int)uVar26) {
        local_860 = (ulong)(uint)reference.m_size.m_data[1];
        uVar31 = 0;
        do {
          local_850 = uVar31;
          if (reference.m_type == TEXTURETYPE_CUBE) {
            __return_storage_ptr__ =
                 (reference.m_texCube.m_ptr)->m_access[uVar31].
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            color.m_data._0_8_ = (__return_storage_ptr__->super_ConstPixelBufferAccess).m_format;
            color.m_data._8_8_ =
                 *(undefined8 *)(__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data
            ;
            auStack_340._4_4_ =
                 (__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data[2];
            auStack_340._0_4_ =
                 (undefined4)
                 ((ulong)*(undefined8 *)
                          (__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data >>
                 0x20);
          }
          else {
            __return_storage_ptr__ = (PixelBufferAccess *)&color;
            LayeredImage::getSliceAccessInternal(__return_storage_ptr__,&reference,(int)uVar31);
          }
          if (0 < (int)(GLuint)local_860) {
            pvVar29 = (__return_storage_ptr__->super_ConstPixelBufferAccess).m_data;
            local_848 = (undefined1  [8])pvVar29;
            local_828._0_4_ = auStack_340._0_4_;
            uVar31 = 0;
            do {
              if (0 < reference.m_size.m_data[0]) {
                uVar32 = 0;
                do {
                  if (iVar12 != 0) {
                    lVar28 = (long)(iVar14 * (int)uVar32) + (long)(auStack_340._0_4_ * (int)uVar31);
                    iVar21 = 0;
                    iVar27 = iVar12;
                    do {
                      uVar35 = *(uint *)((long)pvVar29 + iVar21 / iVar12 + lVar28);
                      if (((uVar35 & 0x7fffffff) == 0x7f800000) ||
                         ((uVar35 & 0x7fffff) != 0 &&
                          ((uVar35 & 0x7f800000) == 0 || (uVar35 & 0x7f800000) == 0x7f800000))) {
                        *(undefined4 *)((long)pvVar29 + iVar21 / iVar12 + lVar28) = 0;
                      }
                      iVar21 = iVar21 + iVar14;
                      iVar27 = iVar27 + -1;
                    } while (iVar27 != 0);
                  }
                  uVar32 = uVar32 + 1;
                } while (uVar32 != (uint)reference.m_size.m_data[0]);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != local_860);
          }
          uVar31 = local_850 + 1;
        } while (uVar31 != uVar26);
      }
    }
  }
  else {
    iVar12 = tcu::TextureFormat::getPixelSize(local_790);
    auVar7 = _local_828;
    local_860 = CONCAT44(local_860._4_4_,iVar12);
    iVar12 = 1;
    if (local_790->order != R) {
      iVar12 = (uint)(local_790->order == RGBA) << 2;
    }
    uVar26 = 6;
    if (reference.m_type != TEXTURETYPE_CUBE) {
      uVar26 = reference.m_size.m_data[2];
    }
    if (0 < (int)uVar26) {
      local_828._4_4_ = 0;
      local_828._0_4_ = reference.m_size.m_data[0];
      _fStack_820 = auVar7._8_8_;
      local_810 = (ulong)(uint)reference.m_size.m_data[1];
      uVar31 = 0;
      do {
        local_750 = uVar31;
        if (reference.m_type == TEXTURETYPE_CUBE) {
          pPVar6 = (reference.m_texCube.m_ptr)->m_access[uVar31].
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          color.m_data._0_8_ = (pPVar6->super_ConstPixelBufferAccess).m_format;
          color.m_data._8_8_ = *(undefined8 *)(pPVar6->super_ConstPixelBufferAccess).m_size.m_data;
          auStack_340._4_4_ = (pPVar6->super_ConstPixelBufferAccess).m_pitch.m_data[2];
          auStack_340._0_4_ =
               (undefined4)
               ((ulong)*(undefined8 *)(pPVar6->super_ConstPixelBufferAccess).m_pitch.m_data >> 0x20)
          ;
          local_338._0_8_ = (pPVar6->super_ConstPixelBufferAccess).m_data;
        }
        else {
          LayeredImage::getSliceAccessInternal((PixelBufferAccess *)&color,&reference,(int)uVar31);
        }
        local_780 = (void *)local_338._0_8_;
        if (0 < (int)(uint)local_810) {
          local_748 = (void *)CONCAT44(local_748._4_4_,auStack_340._0_4_);
          local_880 = 0;
          do {
            if (0 < (int)local_828._0_4_) {
              local_850 = (long)((int)local_748 * (int)local_880) + (long)local_780;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uStack_840;
              _local_848 = auVar7 << 0x40;
              do {
                if (iVar12 != 0) {
                  lVar28 = (long)(int)((GLuint)local_860 * local_848._0_4_) + local_850;
                  iVar27 = 0;
                  iVar14 = iVar12;
                  do {
                    uVar3 = *(ushort *)(lVar28 + iVar27 / iVar12);
                    if (((uVar3 & 0x7fff) == 0x7c00) ||
                       ((uVar3 & 0x3ff) != 0 &&
                        ((uVar3 & 0x7c00) == 0 || (uVar3 & 0x7c00) == 0x7c00))) {
                      res.m_data[0] = 0.0;
                      FVar11 = tcu::Float<unsigned_short,5,10,15,3u>::
                               convert<unsigned_int,8,23,127,3u>
                                         ((Float<unsigned_int,_8,_23,_127,_3U> *)&res);
                      *(StorageType_conflict *)(lVar28 + iVar27 / iVar12) = FVar11.m_value;
                    }
                    iVar27 = iVar27 + (GLuint)local_860;
                    iVar14 = iVar14 + -1;
                  } while (iVar14 != 0);
                }
                lVar28 = (long)local_848 + 1;
                local_848 = (undefined1  [8])lVar28;
              } while ((undefined1  [8])lVar28 != local_828);
            }
            local_880 = local_880 + 1;
          } while (local_880 != local_810);
        }
        uVar31 = local_750 + 1;
      } while (uVar31 != uVar26);
    }
  }
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  pIVar36 = local_830;
  target = local_854;
  glu::CallLogWrapper::glBindTexture(&glLog,local_854,texture0.super_ObjectWrapper.m_object);
  setTexParameteri(&glLog,target);
  poVar1 = (ostringstream *)(color.m_data + 2);
  color.m_data._0_8_ = local_788;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"// Filling texture ",0x13);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," with xor pattern",0x11);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&color,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_2e0);
  uploadTexture(&glLog,&reference,texture0Buf.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c1);
  glu::CallLogWrapper::glBindTexture(&glLog,target,texture1.super_ObjectWrapper.m_object);
  setTexParameteri(&glLog,target);
  isSampler = (undefined1)texture1Buf.super_ObjectWrapper.m_object;
  setTextureStorage(&glLog,pIVar36->m_textureType,local_71c,&local_878,
                    texture1Buf.super_ObjectWrapper.m_object);
  getShaderImageFormatQualifier_abi_cxx11_
            (&shaderImageFormatStr,(Functional *)(ulong)(pIVar36->m_imageFormat).order,
             (TextureFormat *)(ulong)(pIVar36->m_imageFormat).type);
  formatType = pIVar36->m_textureType;
  uVar31 = (ulong)formatType;
  if ((pIVar36->m_singleLayerBind == true) &&
     (bVar10 = formatType < TEXTURETYPE_LAST, formatType = TEXTURETYPE_LAST, bVar10)) {
    formatType = *(TextureType *)(&DAT_01c5a638 + uVar31 * 4);
  }
  renderContext = (RenderContext *)0x0;
  getShaderSamplerOrImageType_abi_cxx11_
            (&shaderImageTypeStr,(Functional *)(ulong)(pIVar36->m_imageFormat).type,formatType,
             TEXTURETYPE_2D,(bool)isSampler);
  type.super_ApiType.m_bits = (ApiType)(*local_868->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  pcVar16 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,pcVar16,(allocator<char> *)&color);
  memset(&scratch,0,0xac);
  local_128._0_8_ = (pointer)0x0;
  local_128[8] = 0;
  local_128._9_7_ = 0;
  local_128[0x10] = 0;
  local_128._17_8_ = 0;
  local_718 = local_708;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_718,glslVersionDeclaration._M_dataplus._M_p,
             glslVersionDeclaration._M_dataplus._M_p + glslVersionDeclaration._M_string_length);
  std::__cxx11::string::append((char *)&local_718);
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_628,(Functional *)(ulong)formatType,(TextureType)local_868,renderContext);
  uVar31 = 0xf;
  if (local_718 != local_708) {
    uVar31 = local_708[0];
  }
  if (uVar31 < local_628._M_string_length + local_710) {
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != &local_628.field_2) {
      uVar20 = local_628.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < local_628._M_string_length + local_710) goto LAB_01478fc2;
    puVar17 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_628,0,(char *)0x0,(ulong)local_718);
  }
  else {
LAB_01478fc2:
    puVar17 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_718,(ulong)local_628._M_dataplus._M_p);
  }
  local_6c8 = &local_6b8;
  plVar18 = puVar17 + 2;
  if ((long *)*puVar17 == plVar18) {
    local_6b8 = *plVar18;
    uStack_6b0 = puVar17[3];
  }
  else {
    local_6b8 = *plVar18;
    local_6c8 = (long *)*puVar17;
  }
  local_6c0 = puVar17[1];
  *puVar17 = plVar18;
  puVar17[1] = 0;
  *(undefined1 *)plVar18 = 0;
  plVar18 = (long *)std::__cxx11::string::append((char *)&local_6c8);
  local_608 = &local_5f8;
  plVar22 = plVar18 + 2;
  if ((long *)*plVar18 == plVar22) {
    local_5f8 = *plVar22;
    lStack_5f0 = plVar18[3];
  }
  else {
    local_5f8 = *plVar22;
    local_608 = (long *)*plVar18;
  }
  local_600 = plVar18[1];
  *plVar18 = (long)plVar22;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_608,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_5e8 = &local_5d8;
  plVar22 = plVar18 + 2;
  if ((long *)*plVar18 == plVar22) {
    local_5d8 = *plVar22;
    lStack_5d0 = plVar18[3];
  }
  else {
    local_5d8 = *plVar22;
    local_5e8 = (long *)*plVar18;
  }
  local_5e0 = plVar18[1];
  *plVar18 = (long)plVar22;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::append((char *)&local_5e8);
  local_5c8 = &local_5b8;
  plVar22 = plVar18 + 2;
  if ((long *)*plVar18 == plVar22) {
    local_5b8 = *plVar22;
    lStack_5b0 = plVar18[3];
  }
  else {
    local_5b8 = *plVar22;
    local_5c8 = (long *)*plVar18;
  }
  local_5c0 = plVar18[1];
  *plVar18 = (long)plVar22;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_5c8,(ulong)shaderImageFormatStr._M_dataplus._M_p);
  local_5a8 = &local_598;
  plVar22 = plVar18 + 2;
  if ((long *)*plVar18 == plVar22) {
    local_598 = *plVar22;
    lStack_590 = plVar18[3];
  }
  else {
    local_598 = *plVar22;
    local_5a8 = (long *)*plVar18;
  }
  local_5a0 = plVar18[1];
  *plVar18 = (long)plVar22;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::append((char *)&local_5a8);
  local_588 = &local_578;
  plVar22 = plVar18 + 2;
  if ((long *)*plVar18 == plVar22) {
    local_578 = *plVar22;
    lStack_570 = plVar18[3];
  }
  else {
    local_578 = *plVar22;
    local_588 = (long *)*plVar18;
  }
  local_580 = plVar18[1];
  *plVar18 = (long)plVar22;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::append((char *)&local_588);
  local_568 = &local_558;
  plVar22 = plVar18 + 2;
  if ((long *)*plVar18 == plVar22) {
    local_558 = *plVar22;
    lStack_550 = plVar18[3];
  }
  else {
    local_558 = *plVar22;
    local_568 = (long *)*plVar18;
  }
  local_560 = plVar18[1];
  *plVar18 = (long)plVar22;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::append((char *)&local_568);
  local_548 = &local_538;
  plVar22 = plVar18 + 2;
  if ((long *)*plVar18 == plVar22) {
    local_538 = *plVar22;
    lStack_530 = plVar18[3];
  }
  else {
    local_538 = *plVar22;
    local_548 = (long *)*plVar18;
  }
  local_540 = plVar18[1];
  *plVar18 = (long)plVar22;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_548,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_528 = &local_518;
  plVar22 = plVar18 + 2;
  if ((long *)*plVar18 == plVar22) {
    local_518 = *plVar22;
    lStack_510 = plVar18[3];
  }
  else {
    local_518 = *plVar22;
    local_528 = (long *)*plVar18;
  }
  local_520 = plVar18[1];
  *plVar18 = (long)plVar22;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::append((char *)&local_528);
  local_508 = &local_4f8;
  plVar22 = plVar18 + 2;
  if ((long *)*plVar18 == plVar22) {
    local_4f8 = *plVar22;
    lStack_4f0 = plVar18[3];
  }
  else {
    local_4f8 = *plVar22;
    local_508 = (long *)*plVar18;
  }
  local_500 = plVar18[1];
  *plVar18 = (long)plVar22;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_508,(ulong)shaderImageFormatStr._M_dataplus._M_p);
  local_4e8 = &local_4d8;
  plVar22 = plVar18 + 2;
  if ((long *)*plVar18 == plVar22) {
    local_4d8 = *plVar22;
    lStack_4d0 = plVar18[3];
  }
  else {
    local_4d8 = *plVar22;
    local_4e8 = (long *)*plVar18;
  }
  local_4e0 = plVar18[1];
  *plVar18 = (long)plVar22;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::append((char *)&local_4e8);
  local_4c8 = &local_4b8;
  plVar22 = plVar18 + 2;
  if ((long *)*plVar18 == plVar22) {
    local_4b8 = *plVar22;
    lStack_4b0 = plVar18[3];
  }
  else {
    local_4b8 = *plVar22;
    local_4c8 = (long *)*plVar18;
  }
  local_4c0 = plVar18[1];
  *plVar18 = (long)plVar22;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::append((char *)&local_4c8);
  local_4a8 = &local_498;
  plVar22 = plVar18 + 2;
  if ((long *)*plVar18 == plVar22) {
    local_498 = *plVar22;
    lStack_490 = plVar18[3];
  }
  else {
    local_498 = *plVar22;
    local_4a8 = (long *)*plVar18;
  }
  local_4a0 = plVar18[1];
  *plVar18 = (long)plVar22;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::append((char *)&local_4a8);
  local_488 = &local_478;
  plVar22 = plVar18 + 2;
  if ((long *)*plVar18 == plVar22) {
    local_478 = *plVar22;
    lStack_470 = plVar18[3];
  }
  else {
    local_478 = *plVar22;
    local_488 = (long *)*plVar18;
  }
  local_480 = plVar18[1];
  *plVar18 = (long)plVar22;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_488,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_468 = &local_458;
  plVar22 = plVar18 + 2;
  if ((long *)*plVar18 == plVar22) {
    local_458 = *plVar22;
    lStack_450 = plVar18[3];
  }
  else {
    local_458 = *plVar22;
    local_468 = (long *)*plVar18;
  }
  local_460 = plVar18[1];
  *plVar18 = (long)plVar22;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  pTVar19 = (TextureFormat *)std::__cxx11::string::append((char *)&local_468);
  TVar23 = (TextureFormat)(pTVar19 + 2);
  if (*pTVar19 == TVar23) {
    local_730 = *(ulong *)TVar23;
    TStack_728 = pTVar19[3];
    local_740._0_8_ = &local_730;
  }
  else {
    local_730 = *(ulong *)TVar23;
    local_740._0_8_ = *pTVar19;
  }
  local_740._8_8_ = pTVar19[1];
  *pTVar19 = TVar23;
  pTVar19[1].order = R;
  pTVar19[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar19[2].order = R;
  iVar12 = local_878.m_data[0];
  if (formatType == TEXTURETYPE_BUFFER) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&color);
    std::ostream::operator<<(&color,iVar12 + -1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&color);
    std::ios_base::~ios_base(local_2e8);
    plVar18 = (long *)std::__cxx11::string::replace((ulong)local_7d0,0,(char *)0x0,0x1c593fe);
    local_808 = &local_7f8;
    plVar22 = plVar18 + 2;
    if ((long *)*plVar18 == plVar22) {
      local_7f8 = *plVar22;
      lStack_7f0 = plVar18[3];
    }
    else {
      local_7f8 = *plVar22;
      local_808 = (long *)*plVar18;
    }
    local_800 = plVar18[1];
    *plVar18 = (long)plVar22;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_808);
    local_7b0 = &local_7a0;
    puVar24 = puVar17 + 2;
    if ((ulong *)*puVar17 == puVar24) {
      local_7a0 = *puVar24;
      uStack_798 = puVar17[3];
    }
    else {
      local_7a0 = *puVar24;
      local_7b0 = (ulong *)*puVar17;
    }
    local_7a8 = puVar17[1];
    *puVar17 = puVar24;
    bVar10 = false;
LAB_01479817:
    bVar8 = false;
  }
  else {
    if (2 < formatType - TEXTURETYPE_CUBE) {
      if (formatType != TEXTURETYPE_2D) {
        local_7b0 = &local_7a0;
        uVar20 = std::__throw_logic_error("basic_string::_M_construct null not valid");
        if ((ulong *)local_740._0_8_ != &local_730) {
          operator_delete((void *)local_740._0_8_,local_730 + 1);
        }
        if (local_468 != &local_458) {
          operator_delete(local_468,local_458 + 1);
        }
        if (local_488 != &local_478) {
          operator_delete(local_488,local_478 + 1);
        }
        if (local_4a8 != &local_498) {
          operator_delete(local_4a8,local_498 + 1);
        }
        if (local_4c8 != &local_4b8) {
          operator_delete(local_4c8,local_4b8 + 1);
        }
        if (local_4e8 != &local_4d8) {
          operator_delete(local_4e8,local_4d8 + 1);
        }
        if (local_508 != &local_4f8) {
          operator_delete(local_508,local_4f8 + 1);
        }
        if (local_528 != &local_518) {
          operator_delete(local_528,local_518 + 1);
        }
        if (local_548 != &local_538) {
          operator_delete(local_548,local_538 + 1);
        }
        if (local_568 != &local_558) {
          operator_delete(local_568,local_558 + 1);
        }
        if (local_588 != &local_578) {
          operator_delete(local_588,local_578 + 1);
        }
        if (local_5a8 != &local_598) {
          operator_delete(local_5a8,local_598 + 1);
        }
        if (local_5c8 != &local_5b8) {
          operator_delete(local_5c8,local_5b8 + 1);
        }
        if (local_5e8 != &local_5d8) {
          operator_delete(local_5e8,local_5d8 + 1);
        }
        if (local_608 != &local_5f8) {
          operator_delete(local_608,local_5f8 + 1);
        }
        if (local_6c8 != &local_6b8) {
          operator_delete(local_6c8,local_6b8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628._M_dataplus._M_p != &local_628.field_2) {
          operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
        }
        if (local_718 != local_708) {
          operator_delete(local_718,local_708[0] + 1);
        }
        glu::ProgramSources::~ProgramSources((ProgramSources *)&scratch);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
          operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                          glslVersionDeclaration.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
          operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                          shaderImageTypeStr.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
          operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                          shaderImageFormatStr.field_2._M_allocated_capacity + 1);
        }
        LayeredImage::~LayeredImage(&reference);
        glu::ObjectWrapper::~ObjectWrapper(&texture1.super_ObjectWrapper);
        glu::ObjectWrapper::~ObjectWrapper(&texture0.super_ObjectWrapper);
        glu::ObjectWrapper::~ObjectWrapper(&texture1Buf.super_ObjectWrapper);
        glu::ObjectWrapper::~ObjectWrapper(&texture0Buf.super_ObjectWrapper);
        glu::CallLogWrapper::~CallLogWrapper(&glLog);
        _Unwind_Resume(uVar20);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&color);
      std::ostream::operator<<(&color,iVar12 + -1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&color);
      std::ios_base::~ios_base(local_2e8);
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_7d0,0,(char *)0x0,0x1c59460);
      local_808 = &local_7f8;
      plVar18 = puVar17 + 2;
      if ((long *)*puVar17 == plVar18) {
        local_7f8 = *plVar18;
        lStack_7f0 = puVar17[3];
      }
      else {
        local_7f8 = *plVar18;
        local_808 = (long *)*puVar17;
      }
      local_800 = puVar17[1];
      *puVar17 = plVar18;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_808);
      local_7b0 = &local_7a0;
      puVar24 = puVar17 + 2;
      if ((ulong *)*puVar17 == puVar24) {
        local_7a0 = *puVar24;
        uStack_798 = puVar17[3];
      }
      else {
        local_7a0 = *puVar24;
        local_7b0 = (ulong *)*puVar17;
      }
      local_7a8 = puVar17[1];
      *puVar17 = puVar24;
      bVar10 = true;
      goto LAB_01479817;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&color);
    std::ostream::operator<<(&color,iVar12 + -1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&color);
    std::ios_base::~ios_base(local_2e8);
    puVar17 = (undefined8 *)std::__cxx11::string::replace((ulong)local_7d0,0,(char *)0x0,0x1c594d7);
    local_808 = &local_7f8;
    plVar18 = puVar17 + 2;
    if ((long *)*puVar17 == plVar18) {
      local_7f8 = *plVar18;
      lStack_7f0 = puVar17[3];
    }
    else {
      local_7f8 = *plVar18;
      local_808 = (long *)*puVar17;
    }
    local_800 = puVar17[1];
    *puVar17 = plVar18;
    puVar17[1] = 0;
    *(undefined1 *)(puVar17 + 2) = 0;
    puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_808);
    local_7b0 = &local_7a0;
    puVar24 = puVar17 + 2;
    if ((ulong *)*puVar17 == puVar24) {
      local_7a0 = *puVar24;
      uStack_798 = puVar17[3];
    }
    else {
      local_7a0 = *puVar24;
      local_7b0 = (ulong *)*puVar17;
    }
    local_7a8 = puVar17[1];
    *puVar17 = puVar24;
    bVar8 = true;
    bVar10 = false;
  }
  puVar17[1] = 0;
  *(undefined1 *)puVar24 = 0;
  uVar31 = 0xf;
  if ((ulong *)local_740._0_8_ != &local_730) {
    uVar31 = local_730;
  }
  if (uVar31 < (ulong)(local_7a8 + local_740._8_8_)) {
    uVar31 = 0xf;
    if (local_7b0 != &local_7a0) {
      uVar31 = local_7a0;
    }
    if ((ulong)(local_7a8 + local_740._8_8_) <= uVar31) {
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_7b0,0,(char *)0x0,local_740._0_8_);
      goto LAB_0147995f;
    }
  }
  puVar17 = (undefined8 *)std::__cxx11::string::_M_append(local_740,(ulong)local_7b0);
LAB_0147995f:
  res_1.m_data._0_8_ = &local_768;
  plVar18 = puVar17 + 2;
  if ((long *)*puVar17 == plVar18) {
    local_768 = *plVar18;
    aiStack_760._0_8_ = puVar17[3];
  }
  else {
    local_768 = *plVar18;
    res_1.m_data._0_8_ = (long *)*puVar17;
  }
  res_1.m_data._8_8_ = puVar17[1];
  *puVar17 = plVar18;
  puVar17[1] = 0;
  *(undefined1 *)plVar18 = 0;
  pTVar19 = (TextureFormat *)std::__cxx11::string::append((char *)&res_1);
  TVar23 = (TextureFormat)(sliceAccess.super_ConstPixelBufferAccess.m_size.m_data + 2);
  TVar25 = (TextureFormat)(pTVar19 + 2);
  if (*pTVar19 == TVar25) {
    sliceAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = *(int *)TVar25;
    sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = pTVar19[2].type;
    sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = pTVar19[3].order;
    sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = pTVar19[3].type;
    sliceAccess.super_ConstPixelBufferAccess.m_format = TVar23;
  }
  else {
    sliceAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = (int)*(long *)TVar25;
    sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
         (int)((ulong)*(long *)TVar25 >> 0x20);
    sliceAccess.super_ConstPixelBufferAccess.m_format = *pTVar19;
  }
  sliceAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_ = pTVar19[1];
  *pTVar19 = TVar25;
  pTVar19[1].order = R;
  pTVar19[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar19[2].order = R;
  __x = &scratchAccess.super_ConstPixelBufferAccess.m_size;
  scratchAccess.super_ConstPixelBufferAccess.m_format.order = RG;
  piVar2 = scratchAccess.super_ConstPixelBufferAccess.m_pitch.m_data + 1;
  scratchAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_ = piVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__x,sliceAccess.super_ConstPixelBufferAccess.m_format,
             sliceAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_ +
             (long)sliceAccess.super_ConstPixelBufferAccess.m_format);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((&scratch.m_size)
                  [((ulong)scratchAccess.super_ConstPixelBufferAccess.m_format & 0xffffffff) * 2 +
                   -1].m_data + 1),(value_type *)__x);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)&res,local_868,(ProgramSources *)&scratch);
  if ((int *)scratchAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_ != piVar2) {
    operator_delete((void *)scratchAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_,
                    scratchAccess.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_ + 1);
  }
  if (sliceAccess.super_ConstPixelBufferAccess.m_format != TVar23) {
    operator_delete((void *)sliceAccess.super_ConstPixelBufferAccess.m_format,
                    CONCAT44(sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0],
                             sliceAccess.super_ConstPixelBufferAccess.m_size.m_data[2]) + 1);
  }
  if ((long *)res_1.m_data._0_8_ != &local_768) {
    operator_delete((void *)res_1.m_data._0_8_,local_768 + 1);
  }
  if (local_7b0 != &local_7a0) {
    operator_delete(local_7b0,local_7a0 + 1);
  }
  if (bVar8) {
    if (local_808 != &local_7f8) {
      operator_delete(local_808,local_7f8 + 1);
    }
    if (local_7d0[0] != local_7c0) {
      operator_delete(local_7d0[0],local_7c0[0] + 1);
    }
  }
  if (bVar10) {
    if (local_808 != &local_7f8) {
      operator_delete(local_808,local_7f8 + 1);
    }
    if (local_7d0[0] != local_7c0) {
      operator_delete(local_7d0[0],local_7c0[0] + 1);
    }
  }
  if (formatType == TEXTURETYPE_BUFFER) {
    if (local_808 != &local_7f8) {
      operator_delete(local_808,local_7f8 + 1);
    }
    if (local_7d0[0] != local_7c0) {
      operator_delete(local_7d0[0],local_7c0[0] + 1);
    }
  }
  if ((ulong *)local_740._0_8_ != &local_730) {
    operator_delete((void *)local_740._0_8_,local_730 + 1);
  }
  if (local_468 != &local_458) {
    operator_delete(local_468,local_458 + 1);
  }
  if (local_488 != &local_478) {
    operator_delete(local_488,local_478 + 1);
  }
  if (local_4a8 != &local_498) {
    operator_delete(local_4a8,local_498 + 1);
  }
  if (local_4c8 != &local_4b8) {
    operator_delete(local_4c8,local_4b8 + 1);
  }
  if (local_4e8 != &local_4d8) {
    operator_delete(local_4e8,local_4d8 + 1);
  }
  if (local_508 != &local_4f8) {
    operator_delete(local_508,local_4f8 + 1);
  }
  if (local_528 != &local_518) {
    operator_delete(local_528,local_518 + 1);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548,local_538 + 1);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568,local_558 + 1);
  }
  if (local_588 != &local_578) {
    operator_delete(local_588,local_578 + 1);
  }
  if (local_5a8 != &local_598) {
    operator_delete(local_5a8,local_598 + 1);
  }
  if (local_5c8 != &local_5b8) {
    operator_delete(local_5c8,local_5b8 + 1);
  }
  if (local_5e8 != &local_5d8) {
    operator_delete(local_5e8,local_5d8 + 1);
  }
  if (local_608 != &local_5f8) {
    operator_delete(local_608,local_5f8 + 1);
  }
  if (local_6c8 != &local_6b8) {
    operator_delete(local_6c8,local_6b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if (local_718 != local_708) {
    operator_delete(local_718,local_708[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_148);
  lVar28 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)scratch.m_size.m_data + lVar28 + -8));
    lVar28 = lVar28 + -0x18;
  } while (lVar28 != -0x18);
  color.m_data[0] = (*local_868->_vptr_RenderContext[3])();
  color.m_data[1] = extraout_var_04;
  local_338._M_left = &local_338;
  color.m_data._8_8_ = local_788;
  local_338._0_8_ = local_338._0_8_ & 0xffffffff00000000;
  local_338._M_parent = (_Base_ptr)0x0;
  local_318 = 0;
  local_338._M_right = local_338._M_left;
  glu::operator<<(local_788,(ShaderProgram *)&res);
  local_750 = CONCAT71(local_750._1_7_,local_48);
  if (local_48 == false) {
    tcu::TestContext::setTestResult
              ((local_830->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,local_70);
    if (local_830->m_singleLayerBind == true) {
      if (0 < (int)uVar38) {
        local_860 = CONCAT44(local_860._4_4_,local_878.m_data[0]);
        iVar12 = local_878.m_data[1];
        uVar26 = 0;
        do {
          if (uVar26 != 0) {
            glu::CallLogWrapper::glMemoryBarrier(&glLog,0x20);
          }
          glu::CallLogWrapper::glBindImageTexture
                    (&glLog,0,texture0.super_ObjectWrapper.m_object,0,'\0',uVar26,35000,format);
          iVar14 = (*local_868->_vptr_RenderContext[3])();
          dVar13 = (**(code **)(CONCAT44(extraout_var_05,iVar14) + 0x800))();
          glu::checkError(dVar13,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                          ,0x5c4);
          glu::CallLogWrapper::glBindImageTexture
                    (&glLog,1,texture1.super_ObjectWrapper.m_object,0,'\0',uVar26,0x88b9,format);
          iVar14 = (*local_868->_vptr_RenderContext[3])();
          dVar13 = (**(code **)(CONCAT44(extraout_var_06,iVar14) + 0x800))();
          glu::checkError(dVar13,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                          ,0x5c7);
          glu::CallLogWrapper::glDispatchCompute(&glLog,(GLuint)local_860,iVar12,1);
          iVar14 = (*local_868->_vptr_RenderContext[3])();
          dVar13 = (**(code **)(CONCAT44(extraout_var_07,iVar14) + 0x800))();
          glu::checkError(dVar13,"glDispatchCompute",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                          ,0x5ca);
          uVar26 = uVar26 + 1;
        } while (uVar38 != uVar26);
      }
    }
    else {
      glu::CallLogWrapper::glBindImageTexture
                (&glLog,0,texture0.super_ObjectWrapper.m_object,0,'\x01',0,35000,format);
      iVar12 = (*local_868->_vptr_RenderContext[3])();
      dVar13 = (**(code **)(CONCAT44(extraout_var_08,iVar12) + 0x800))();
      glu::checkError(dVar13,"glBindImageTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x5d0);
      glu::CallLogWrapper::glBindImageTexture
                (&glLog,1,texture1.super_ObjectWrapper.m_object,0,'\x01',0,0x88b9,format);
      iVar12 = (*local_868->_vptr_RenderContext[3])();
      dVar13 = (**(code **)(CONCAT44(extraout_var_09,iVar12) + 0x800))();
      glu::checkError(dVar13,"glBindImageTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x5d3);
      glu::CallLogWrapper::glDispatchCompute(&glLog,local_878.m_data[0],local_878.m_data[1],uVar38);
      iVar12 = (*local_868->_vptr_RenderContext[3])();
      dVar13 = (**(code **)(CONCAT44(extraout_var_10,iVar12) + 0x800))();
      glu::checkError(dVar13,"glDispatchCompute",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x5d6);
    }
    pTVar19 = local_790;
    pIVar36 = local_830;
    if (((local_830->m_textureFormat).order != (local_830->m_imageFormat).order) ||
       ((local_830->m_textureFormat).type != (local_830->m_imageFormat).type)) {
      iVar12 = tcu::TextureFormat::getPixelSize(local_790);
      tcu::TextureLevel::TextureLevel(&scratch,pTVar19,1,1,1);
      tcu::TextureLevel::getAccess(&scratchAccess,&scratch);
      if (0 < (int)uVar38) {
        local_828 = (undefined1  [8])(local_878.m_data._0_8_ & 0xffffffff);
        local_850 = (ulong)local_878.m_data._0_8_ >> 0x20;
        local_748 = (void *)(ulong)uVar38;
        pvVar29 = (void *)0x0;
        do {
          local_780 = pvVar29;
          if (pIVar36->m_textureType == TEXTURETYPE_CUBE) {
            pTVar19 = (TextureFormat *)
                      (reference.m_texCube.m_ptr)->m_access[(long)pvVar29].
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            sliceAccess.super_ConstPixelBufferAccess.m_format = *pTVar19;
            sliceAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = pTVar19[2].order;
            sliceAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_ = pTVar19[1];
            sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = pTVar19[3].type;
            sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
                 (int)*(undefined8 *)&pTVar19[2].type;
            sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
                 (int)((ulong)*(undefined8 *)&pTVar19[2].type >> 0x20);
            sliceAccess.super_ConstPixelBufferAccess.m_data = *(void **)(pTVar19 + 4);
          }
          else {
            LayeredImage::getSliceAccessInternal(&sliceAccess,&reference,(int)pvVar29);
          }
          pvVar29 = sliceAccess.super_ConstPixelBufferAccess.m_data;
          if (0 < (int)(uint)local_850) {
            local_810 = CONCAT44(local_810._4_4_,
                                 sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1]);
            auVar9._8_8_ = 0;
            auVar9._0_8_ = uStack_840;
            _local_848 = auVar9 << 0x40;
            do {
              if (0 < (int)local_828._0_4_) {
                local_860 = (long)(int)((uint)local_810 * local_848._0_4_) + (long)pvVar29;
                iVar14 = 0;
                auVar34 = local_828;
                do {
                  __src = (void *)((long)iVar14 + local_860);
                  memcpy(scratchAccess.super_ConstPixelBufferAccess.m_data,__src,(long)iVar12);
                  CVar4 = (local_830->m_imageFormat).type;
                  iVar27 = (int)&scratchAccess;
                  if ((((ulong)CVar4 < 0x22) && ((0x2c0000000U >> ((ulong)CVar4 & 0x3f) & 1) != 0))
                     || (CVar4 - SIGNED_INT8 < 3)) {
                    tcu::ConstPixelBufferAccess::getPixelInt
                              ((ConstPixelBufferAccess *)local_740,iVar27,0,0);
                    res_1.m_data[0] = local_740._0_4_;
                    res_1.m_data[1] = local_740._4_4_;
                    res_1.m_data[2] = local_740._8_4_;
                    res_1.m_data[3] = local_740._12_4_;
                    tcu::PixelBufferAccess::setPixel(&scratchAccess,&res_1,0,0,0);
                  }
                  else {
                    tcu::ConstPixelBufferAccess::getPixel
                              ((ConstPixelBufferAccess *)&res_1,iVar27,0,0);
                    tcu::PixelBufferAccess::setPixel(&scratchAccess,(Vec4 *)&res_1,0,0,0);
                  }
                  memcpy(__src,scratchAccess.super_ConstPixelBufferAccess.m_data,(long)iVar12);
                  iVar14 = iVar14 + iVar12;
                  auVar34 = (undefined1  [8])((long)auVar34 + -1);
                } while (auVar34 != (undefined1  [8])0x0);
              }
              uVar31 = (long)local_848 + 1;
              local_848 = (undefined1  [8])uVar31;
            } while (uVar31 != local_850);
          }
          pvVar29 = (void *)((long)local_780 + 1);
          pIVar36 = local_830;
        } while (pvVar29 != local_748);
      }
      tcu::TextureLevel::~TextureLevel(&scratch);
    }
    if (0 < (int)uVar38) {
      local_848._0_4_ = local_878.m_data[1];
      local_860 = CONCAT44(local_860._4_4_,local_878.m_data[0] / 2);
      local_828 = (undefined1  [8])(local_878.m_data._0_8_ & 0xffffffff);
      local_850 = CONCAT44(local_850._4_4_,local_878.m_data[0] + -1);
      uVar26 = 0;
      do {
        if (0 < (int)local_848._0_4_) {
          iVar12 = 0;
          do {
            if (1 < (int)local_828._0_4_) {
              iVar27 = 0;
              iVar14 = (uint)local_850;
              do {
                iVar21 = (int)&reference;
                if (bVar37) {
                  LayeredImage::getPixelInt((LayeredImage *)&scratch,iVar21,iVar14,iVar12);
                  scratchAccess.super_ConstPixelBufferAccess.m_format = scratch.m_format;
                  scratchAccess.super_ConstPixelBufferAccess.m_size.m_data[0] =
                       scratch.m_size.m_data[0];
                  scratchAccess.super_ConstPixelBufferAccess.m_size.m_data[1] =
                       scratch.m_size.m_data[1];
                  LayeredImage::getPixelInt((LayeredImage *)&scratch,iVar21,iVar27,iVar12);
                  sliceAccess.super_ConstPixelBufferAccess.m_format = scratch.m_format;
                  sliceAccess.super_ConstPixelBufferAccess.m_size.m_data[0] =
                       scratch.m_size.m_data[0];
                  sliceAccess.super_ConstPixelBufferAccess.m_size.m_data[1] =
                       scratch.m_size.m_data[1];
                  Functional::(anonymous_namespace)::LayeredImage::
                  setPixel<tcu::Vector<unsigned_int,4>>
                            ((LayeredImage *)&reference,iVar14,iVar12,uVar26,
                             (Vector<unsigned_int,_4> *)&sliceAccess);
                  Functional::(anonymous_namespace)::LayeredImage::
                  setPixel<tcu::Vector<unsigned_int,4>>
                            ((LayeredImage *)&reference,iVar27,iVar12,uVar26,
                             (Vector<unsigned_int,_4> *)&scratchAccess);
                }
                else {
                  LayeredImage::getPixel((LayeredImage *)&scratch,iVar21,iVar14,iVar12);
                  LayeredImage::getPixel((LayeredImage *)&scratchAccess,iVar21,iVar27,iVar12);
                  Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                            ((LayeredImage *)&reference,iVar14,iVar12,uVar26,
                             (Vector<float,_4> *)&scratchAccess);
                  Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                            ((LayeredImage *)&reference,iVar27,iVar12,uVar26,
                             (Vector<float,_4> *)&scratch);
                }
                iVar27 = iVar27 + 1;
                iVar14 = iVar14 + -1;
              } while ((GLuint)local_860 != iVar27);
            }
            iVar12 = iVar12 + 1;
          } while (iVar12 != local_848._0_4_);
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar38);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)auStack_340);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&res);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
    operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                    shaderImageTypeStr.field_2._M_allocated_capacity + 1);
  }
  pIVar36 = local_830;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
    operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                    shaderImageFormatStr.field_2._M_allocated_capacity + 1);
  }
  if ((char)local_750 != '\0') {
    color.m_data._0_8_ = &PTR_operator___02162e60;
    color.m_data._8_8_ = &reference;
    bVar10 = readTextureAndVerify
                       (local_868,&glLog,texture1.super_ObjectWrapper.m_object,
                        texture1Buf.super_ObjectWrapper.m_object,pIVar36->m_textureType,
                        &this->m_textureFormat,&local_878,(ImageLayerVerifier *)&color);
    pcVar16 = "Image comparison failed";
    if (bVar10) {
      pcVar16 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((pIVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar10,
               pcVar16);
  }
  LayeredImage::~LayeredImage(&reference);
  glu::ObjectWrapper::~ObjectWrapper(&texture1.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&texture0.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&texture1Buf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&texture0Buf.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

ImageLoadAndStoreCase::IterateResult ImageLoadAndStoreCase::iterate (void)
{
	const RenderContext&		renderCtx					= m_context.getRenderContext();
	TestLog&					log							(m_testCtx.getLog());
	glu::CallLogWrapper			glLog						(renderCtx.getFunctions(), log);
	const deUint32				textureInternalFormatGL		= glu::getInternalFormat(m_textureFormat);
	const deUint32				imageInternalFormatGL		= glu::getInternalFormat(m_imageFormat);
	const deUint32				textureTargetGL				= getGLTextureTarget(m_textureType);
	const IVec3&				imageSize					= defaultImageSize(m_textureType);
	const int					maxImageDimension			= de::max(imageSize.x(), de::max(imageSize.y(), imageSize.z()));
	const float					storeColorScale				= isFormatTypeUnorm(m_textureFormat.type) ? 1.0f / (float)(maxImageDimension - 1)
															: isFormatTypeSnorm(m_textureFormat.type) ? 2.0f / (float)(maxImageDimension - 1)
															: 1.0f;
	const float					storeColorBias				= isFormatTypeSnorm(m_textureFormat.type) ? -1.0f : 0.0f;
	const int					numSlicesOrFaces			= m_textureType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const bool					isIntegerTextureFormat		= isFormatTypeInteger(m_textureFormat.type);
	const glu::Buffer			texture0Buf					(renderCtx);
	const glu::Buffer			texture1Buf					(renderCtx);
	const glu::Texture			texture0					(renderCtx);
	const glu::Texture			texture1					(renderCtx);
	LayeredImage				reference					(m_textureType, m_textureFormat, imageSize.x(), imageSize.y(), imageSize.z());

	glLog.enableLogging(true);

	// Setup textures.

	log << TestLog::Message << "// Created 2 textures (names " << *texture0 << " and " << *texture1 << ")" << TestLog::EndMessage;
	if (m_textureType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created buffers for the textures (names " << *texture0Buf << " and " << *texture1Buf << ")" << TestLog::EndMessage;

	// First, fill reference with (a fairly arbitrary) initial pattern. This will be used as texture upload source data as well as for actual reference computation later on.

	DE_ASSERT(!isIntegerTextureFormat || (storeColorScale == 1.0f && storeColorBias == 0.0f));

	for (int z = 0; z < numSlicesOrFaces; z++)
	for (int y = 0; y < imageSize.y(); y++)
	for (int x = 0; x < imageSize.x(); x++)
	{
		const IVec4 color(x^y^z, (imageSize.x()-1-x)^y^z, x^(imageSize.y()-1-y)^z, (imageSize.x()-1-x)^(imageSize.y()-1-y)^z);

		if (isIntegerTextureFormat)
			reference.setPixel(x, y, z, color);
		else
			reference.setPixel(x, y, z, color.asFloat()*storeColorScale + storeColorBias);
	}

	// If re-interpreting the texture contents as floating point values, need to get rid of inf, nan etc.
	if (m_imageFormat.type == TextureFormat::HALF_FLOAT && m_textureFormat.type != TextureFormat::HALF_FLOAT)
		replaceBadFloatReinterpretValues<TextureFormat::HALF_FLOAT, tcu::Float16, deUint16>(reference, m_imageFormat);
	else if (m_imageFormat.type == TextureFormat::FLOAT && m_textureFormat.type != TextureFormat::FLOAT)
		replaceBadFloatReinterpretValues<TextureFormat::FLOAT, tcu::Float32, deUint32>(reference, m_imageFormat);

	// Upload initial pattern to texture 0.

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(textureTargetGL, *texture0);
	setTexParameteri(glLog, textureTargetGL);

	log << TestLog::Message << "// Filling texture " << *texture0 << " with xor pattern" << TestLog::EndMessage;

	uploadTexture(glLog, reference, *texture0Buf);

	// Set storage for texture 1.

	glLog.glActiveTexture(GL_TEXTURE1);
	glLog.glBindTexture(textureTargetGL, *texture1);
	setTexParameteri(glLog, textureTargetGL);
	setTextureStorage(glLog, m_textureType, textureInternalFormatGL, imageSize, *texture1Buf);

	// Perform image loads and stores in compute shader and finalize reference computation.

	{
		// Generate compute shader.

		const char* const		maybeRestrict			= m_restrictImages ? "restrict" : "";
		const string			shaderImageFormatStr	= getShaderImageFormatQualifier(m_imageFormat);
		const TextureType		shaderImageType			= m_singleLayerBind ? textureLayerType(m_textureType) : m_textureType;
		const string			shaderImageTypeStr		= getShaderImageType(m_imageFormat.type, shaderImageType);
		const std::string		glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ textureTypeExtensionShaderRequires(shaderImageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) " + maybeRestrict + " readonly uniform " + shaderImageTypeStr + " u_image0;\n"
														"layout (" + shaderImageFormatStr + ", binding=1) " + maybeRestrict + " writeonly uniform " + shaderImageTypeStr + " u_image1;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														+ (shaderImageType == TEXTURETYPE_BUFFER ?
															"	int pos = int(gl_GlobalInvocationID.x);\n"
															"	imageStore(u_image1, pos, imageLoad(u_image0, " + toString(imageSize.x()-1) + "-pos));\n"
														 : shaderImageType == TEXTURETYPE_2D ?
															"	ivec2 pos = ivec2(gl_GlobalInvocationID.xy);\n"
															"	imageStore(u_image1, pos, imageLoad(u_image0, ivec2(" + toString(imageSize.x()-1) + "-pos.x, pos.y)));\n"
														 : shaderImageType == TEXTURETYPE_3D || shaderImageType == TEXTURETYPE_CUBE || shaderImageType == TEXTURETYPE_2D_ARRAY ?
															"	ivec3 pos = ivec3(gl_GlobalInvocationID);\n"
															"	imageStore(u_image1, pos, imageLoad(u_image0, ivec3(" + toString(imageSize.x()-1) + "-pos.x, pos.y, pos.z)));\n"
														 : DE_NULL) +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		if (m_singleLayerBind)
		{
			for (int layerNdx = 0; layerNdx < numSlicesOrFaces; layerNdx++)
			{
				if (layerNdx > 0)
					glLog.glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

				glLog.glBindImageTexture(0, *texture0, 0, GL_FALSE, layerNdx, GL_READ_ONLY, imageInternalFormatGL);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

				glLog.glBindImageTexture(1, *texture1, 0, GL_FALSE, layerNdx, GL_WRITE_ONLY, imageInternalFormatGL);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

				glLog.glDispatchCompute(imageSize.x(), imageSize.y(), 1);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
			}
		}
		else
		{
			glLog.glBindImageTexture(0, *texture0, 0, GL_TRUE, 0, GL_READ_ONLY, imageInternalFormatGL);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

			glLog.glBindImageTexture(1, *texture1, 0, GL_TRUE, 0, GL_WRITE_ONLY, imageInternalFormatGL);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

			glLog.glDispatchCompute(imageSize.x(), imageSize.y(), numSlicesOrFaces);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
		}

		// Finalize reference.

		if (m_textureFormat != m_imageFormat)
		{
			// Format re-interpretation case. Read data with image format and write back, with the same image format.
			// We do this because the data may change a little during lookups (e.g. unorm8 -> float; not all unorms can be exactly represented as floats).

			const int					pixelSize		= m_imageFormat.getPixelSize();
			tcu::TextureLevel			scratch			(m_imageFormat, 1, 1);
			const PixelBufferAccess		scratchAccess	= scratch.getAccess();

			for (int z = 0; z < numSlicesOrFaces; z++)
			{
				const PixelBufferAccess		sliceAccess		= m_textureType == TEXTURETYPE_CUBE ? reference.getCubeFaceAccess((tcu::CubeFace)z) : reference.getSliceAccess(z);
				const int					rowPitch		= sliceAccess.getRowPitch();
				void *const					data			= sliceAccess.getDataPtr();

				for (int y = 0; y < imageSize.y(); y++)
				for (int x = 0; x < imageSize.x(); x++)
				{
					void *const pixelData = (deUint8*)data + y*rowPitch + x*pixelSize;

					deMemcpy(scratchAccess.getDataPtr(), pixelData, pixelSize);

					if (isFormatTypeInteger(m_imageFormat.type))
						scratchAccess.setPixel(scratchAccess.getPixelUint(0, 0), 0, 0);
					else
						scratchAccess.setPixel(scratchAccess.getPixel(0, 0), 0, 0);

					deMemcpy(pixelData, scratchAccess.getDataPtr(), pixelSize);
				}
			}
		}

		for (int z = 0; z < numSlicesOrFaces; z++)
		for (int y = 0; y < imageSize.y(); y++)
		for (int x = 0; x < imageSize.x()/2; x++)
		{
			if (isIntegerTextureFormat)
			{
				const UVec4 temp = reference.getPixelUint(imageSize.x()-1-x, y, z);
				reference.setPixel(imageSize.x()-1-x, y, z, reference.getPixelUint(x, y, z));
				reference.setPixel(x, y, z, temp);
			}
			else
			{
				const Vec4 temp = reference.getPixel(imageSize.x()-1-x, y, z);
				reference.setPixel(imageSize.x()-1-x, y, z, reference.getPixel(x, y, z));
				reference.setPixel(x, y, z, temp);
			}
		}
	}

	// Read texture 1 and compare to reference.

	const bool compareOk = readTextureAndVerify(renderCtx, glLog, *texture1, *texture1Buf, m_textureType, m_textureFormat, imageSize, ImageLayerComparer(reference));

	m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, compareOk ? "Pass" : "Image comparison failed");
	return STOP;
}